

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  ImGuiContext *pIVar1;
  long lVar2;
  uint uVar3;
  void *local_10;
  
  pIVar1 = GImGui;
  local_10 = ptr;
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    uVar3 = ~(this->IDStack).Data[lVar2 + -1];
    lVar2 = 0;
    do {
      uVar3 = uVar3 >> 8 ^
              GCrc32LookupTable[(uint)*(byte *)((long)&local_10 + lVar2) ^ uVar3 & 0xff];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    uVar3 = ~uVar3;
    if (GImGui->ActiveId == uVar3) {
      GImGui->ActiveIdIsAlive = uVar3;
    }
    if (pIVar1->ActiveIdPreviousFrame == uVar3) {
      pIVar1->ActiveIdPreviousFrameIsAlive = true;
    }
    if (pIVar1->DebugHookIdInfo == uVar3) {
      ImGui::DebugHookIdInfo(uVar3,0xc,ptr,(void *)0x0);
    }
    return uVar3;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                ,0x70b,"T &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGui::KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_Pointer, ptr, NULL);
    return id;
}